

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O1

void __thiscall
jsoncons::csv::
basic_csv_cursor<char,_jsoncons::iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::read_next(basic_csv_cursor<char,_jsoncons::iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
            *this,basic_json_visitor<char> *visitor,error_code *ec)

{
  size_t *psVar1;
  int iVar2;
  pointer pcVar3;
  pointer pcVar4;
  char *pcVar5;
  pointer pcVar6;
  char *pcVar7;
  char *length;
  type tVar8;
  
  (this->parser_).more_ = true;
  do {
    if ((this->parser_).input_ptr_ == (this->parser_).input_end_) {
      if ((this->source_).source_.current_.p_ == (this->source_).source_.end_.p_) {
LAB_0036d2bd:
        length = (char *)0x0;
        pcVar7 = (char *)0x0;
      }
      else {
        if ((this->source_).source_.buffer_length_ == 0) {
          pcVar3 = (this->source_).source_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pcVar4 = (this->source_).source_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pcVar6 = pcVar3;
          if (pcVar4 != pcVar3 && -1 < (long)pcVar4 - (long)pcVar3) {
            do {
              pcVar5 = (this->source_).source_.current_.p_;
              if (pcVar5 == (this->source_).source_.end_.p_) break;
              *pcVar6 = *pcVar5;
              pcVar6 = pcVar6 + 1;
              (this->source_).source_.current_.p_ = (this->source_).source_.current_.p_ + 1;
            } while (pcVar6 < pcVar4);
          }
          psVar1 = &(this->source_).source_.position_;
          *psVar1 = *psVar1 + ((long)pcVar6 - (long)pcVar3);
          (this->source_).source_.buffer_length_ = (long)pcVar6 - (long)pcVar3;
        }
        pcVar5 = (this->source_).source_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        length = (char *)(this->source_).source_.buffer_length_;
        (this->source_).source_.buffer_length_ = 0;
        pcVar7 = pcVar5;
        if ((length != (char *)0x0) && ((this->source_).bof_ != false)) {
          tVar8 = unicode_traits::detect_encoding_from_bom<char>(pcVar5,(size_t)length);
          pcVar7 = tVar8.ptr;
          if (utf8 < tVar8.encoding) {
            std::error_code::operator=(ec,illegal_unicode_character);
            goto LAB_0036d2bd;
          }
          length = pcVar5 + ((long)length - (long)pcVar7);
          (this->source_).bof_ = false;
        }
      }
      iVar2 = ec->_M_value;
      if ((iVar2 == 0) && (length != (char *)0x0)) {
        (this->parser_).begin_input_ = pcVar7;
        (this->parser_).input_end_ = pcVar7 + (long)length;
        (this->parser_).input_ptr_ = pcVar7;
      }
      if (iVar2 != 0) {
        return;
      }
    }
    basic_csv_parser<char,_std::allocator<char>_>::parse_some(&this->parser_,visitor,ec);
    if (ec->_M_value != 0) {
      return;
    }
    if (((this->parser_).more_ & 1U) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void read_next(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        parser_.restart();
        while (!parser_.stopped())
        {
            if (parser_.source_exhausted())
            {
                auto s = source_.read_buffer(ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
                if (s.size() > 0)
                {
                    parser_.update(s.data(),s.size());
                }
            }
            parser_.parse_some(visitor, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
        }
    }